

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O3

void ihevc_itrans_8x8(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                     WORD32 i4_shift,WORD32 zero_cols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 in_XMM0 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar1 = 1 << ((char)i4_shift - 1U & 0x1f);
  auVar13 = pmovsxwd(in_XMM0,0x120032004b0059);
  auVar14 = pmovsxwd(in_XMM1,0xffceffa7ffee004b);
  auVar15 = pmovsxwd(in_XMM2,0x4b0012ffa70032);
  auVar16 = pmovsxwd(in_XMM3,0xffa7004bffce0012);
  auVar17 = pmovzxdq(ZEXT416((uint)i4_shift),ZEXT416((uint)i4_shift));
  lVar7 = 0;
  do {
    if ((zero_cols & 1U) == 0) {
      iVar2 = (int)*(short *)((long)pi2_src + lVar7 + (long)(src_strd * 7) * 2);
      iVar5 = (int)*(short *)((long)pi2_src + lVar7 + (long)(src_strd * 5) * 2);
      iVar10 = (int)*(short *)((long)pi2_src + lVar7 + (long)(src_strd * 3) * 2);
      iVar11 = (int)*(short *)((long)pi2_src + lVar7 + (long)src_strd * 2);
      iVar6 = (int)*(short *)((long)pi2_src + lVar7 + (long)(src_strd * 2) * 2);
      iVar3 = (int)*(short *)((long)pi2_src + lVar7 + (long)(src_strd * 6) * 2);
      iVar12 = iVar3 * 0x24 + iVar6 * 0x53;
      iVar4 = iVar3 * -0x53 + iVar6 * 0x24;
      iVar3 = (int)*(short *)((long)pi2_src + lVar7 + (long)(src_strd * 4) * 2);
      iVar9 = iVar3 * 0x40 + *(short *)((long)pi2_src + lVar7) * 0x40;
      iVar8 = iVar3 * -0x40 + *(short *)((long)pi2_src + lVar7) * 0x40;
      iVar3 = iVar12 + iVar9;
      iVar9 = iVar9 - iVar12;
      iVar6 = iVar8 + iVar4;
      iVar8 = iVar8 - iVar4;
      auVar18._4_4_ = iVar11;
      auVar18._0_4_ = iVar11;
      auVar18._8_4_ = iVar11;
      auVar18._12_4_ = iVar11;
      auVar18 = pmulld(auVar18,auVar13);
      auVar23._4_4_ = iVar10;
      auVar23._0_4_ = iVar10;
      auVar23._8_4_ = iVar10;
      auVar23._12_4_ = iVar10;
      auVar20 = pmulld(auVar23,auVar14);
      auVar19._4_4_ = iVar5;
      auVar19._0_4_ = iVar5;
      auVar19._8_4_ = iVar5;
      auVar19._12_4_ = iVar5;
      auVar19 = pmulld(auVar19,auVar15);
      auVar22._4_4_ = iVar2;
      auVar22._0_4_ = iVar2;
      auVar22._8_4_ = iVar2;
      auVar22._12_4_ = iVar2;
      auVar23 = pmulld(auVar22,auVar16);
      iVar2 = auVar23._0_4_ + auVar19._0_4_ + auVar20._0_4_ + auVar18._0_4_;
      iVar4 = auVar23._4_4_ + auVar19._4_4_ + auVar20._4_4_ + auVar18._4_4_;
      iVar5 = auVar23._8_4_ + auVar19._8_4_ + auVar20._8_4_ + auVar18._8_4_;
      iVar10 = auVar23._12_4_ + auVar19._12_4_ + auVar20._12_4_ + auVar18._12_4_;
      auVar20._0_4_ = iVar1 + iVar2 + iVar3 >> auVar17;
      auVar20._4_4_ = iVar1 + iVar4 + iVar6 >> auVar17;
      auVar20._8_4_ = iVar1 + iVar5 + iVar8 >> auVar17;
      auVar20._12_4_ = iVar1 + iVar10 + iVar9 >> auVar17;
      auVar21._0_4_ = (iVar9 + iVar1) - iVar10 >> auVar17;
      auVar21._4_4_ = (iVar8 + iVar1) - iVar5 >> auVar17;
      auVar21._8_4_ = (iVar6 + iVar1) - iVar4 >> auVar17;
      auVar21._12_4_ = (iVar3 + iVar1) - iVar2 >> auVar17;
      auVar18 = packssdw(auVar20,auVar21);
      *(undefined1 (*) [16])pi2_dst = auVar18;
    }
    else {
      *(WORD16 *)((long)pi2_dst + 0) = 0;
      *(WORD16 *)((long)pi2_dst + 2) = 0;
      *(WORD16 *)((long)pi2_dst + 4) = 0;
      *(WORD16 *)((long)pi2_dst + 6) = 0;
      *(WORD16 *)((long)pi2_dst + 8) = 0;
      *(WORD16 *)((long)pi2_dst + 10) = 0;
      *(WORD16 *)((long)pi2_dst + 0xc) = 0;
      *(WORD16 *)((long)pi2_dst + 0xe) = 0;
    }
    zero_cols = zero_cols >> 1;
    lVar7 = lVar7 + 2;
    pi2_dst = (WORD16 *)((long)*(undefined1 (*) [16])pi2_dst + (long)dst_strd * 2);
  } while ((int)lVar7 != 0x10);
  return;
}

Assistant:

void ihevc_itrans_8x8(WORD16 *pi2_src,
                      WORD16 *pi2_dst,
                      WORD32 src_strd,
                      WORD32 dst_strd,
                      WORD32 i4_shift,
                      WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[4], o[4];
    WORD32 ee[2], eo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_8; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_8 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 4; k++)
            {
                o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_8[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_8[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_8[7][k]
                                                * pi2_src[7 * src_strd];
            }

            eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd]
                            + g_ai2_ihevc_trans_8[6][0] * pi2_src[6 * src_strd];
            eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd]
                            + g_ai2_ihevc_trans_8[6][1] * pi2_src[6 * src_strd];
            ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_8[4][0] * pi2_src[4 * src_strd];
            ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_8[4][1] * pi2_src[4 * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            e[0] = ee[0] + eo[0];
            e[3] = ee[0] - eo[0];
            e[1] = ee[1] + eo[1];
            e[2] = ee[1] - eo[1];
            for(k = 0; k < 4; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 4] =
                                CLIP_S16(((e[3 - k] - o[3 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}